

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cab_session.cpp
# Opt level: O2

void __thiscall cab_session::~cab_session(cab_session *this)

{
  socket *this_00;
  cab_manager *this_01;
  ostream *poVar1;
  data_union local_94;
  address local_78;
  string local_58;
  endpoint_type local_34;
  
  if (this->_cab != (cab *)0x0) {
    this_01 = application::manager(this->_application);
    cab_manager::remove(this_01,(char *)this->_cab);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Cab connection from ");
  this_00 = &this->_socket;
  boost::asio::
  basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::remote_endpoint((endpoint_type *)&local_94.base,
                    &this_00->
                     super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                   );
  if (local_94.base.sa_family != 2) {
    local_78.ipv6_address_.addr_.__in6_u.__u6_addr8[0] = local_94.base.sa_data[6];
    local_78.ipv6_address_.addr_.__in6_u.__u6_addr8[1] = local_94.base.sa_data[7];
    local_78.ipv6_address_.addr_.__in6_u.__u6_addr8[2] = local_94.base.sa_data[8];
    local_78.ipv6_address_.addr_.__in6_u.__u6_addr8[3] = local_94.base.sa_data[9];
    local_78.ipv6_address_.addr_.__in6_u.__u6_addr8[4] = local_94.base.sa_data[10];
    local_78.ipv6_address_.addr_.__in6_u.__u6_addr8[5] = local_94.base.sa_data[0xb];
    local_78.ipv6_address_.addr_.__in6_u.__u6_addr8[6] = local_94.base.sa_data[0xc];
    local_78.ipv6_address_.addr_.__in6_u.__u6_addr8[7] = local_94.base.sa_data[0xd];
    local_78.ipv6_address_.addr_.__in6_u._8_8_ = local_94._16_8_;
    local_78.ipv6_address_.scope_id_ = (unsigned_long)local_94.v6.sin6_scope_id;
    local_94.v6.sin6_flowinfo = 0;
  }
  else {
    local_78.ipv6_address_.addr_.__in6_u.__u6_addr8[0] = '\0';
    local_78.ipv6_address_.addr_.__in6_u.__u6_addr8[1] = '\0';
    local_78.ipv6_address_.addr_.__in6_u.__u6_addr8[2] = '\0';
    local_78.ipv6_address_.addr_.__in6_u.__u6_addr8[3] = '\0';
    local_78.ipv6_address_.addr_.__in6_u.__u6_addr8[4] = '\0';
    local_78.ipv6_address_.addr_.__in6_u.__u6_addr8[5] = '\0';
    local_78.ipv6_address_.addr_.__in6_u.__u6_addr8[6] = '\0';
    local_78.ipv6_address_.addr_.__in6_u.__u6_addr8[7] = '\0';
    local_78.ipv6_address_.addr_.__in6_u._8_8_ = 0;
    local_78.ipv6_address_.scope_id_ = 0;
  }
  local_78.type_ = (anon_enum_32)(local_94.base.sa_family != 2);
  local_78.ipv4_address_.addr_.s_addr = local_94.v4.sin_addr.s_addr;
  boost::asio::ip::address::to_string_abi_cxx11_(&local_58,&local_78);
  poVar1 = std::operator<<(poVar1,(string *)&local_58);
  poVar1 = std::operator<<(poVar1,":");
  boost::asio::
  basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::remote_endpoint(&local_34,
                    &this_00->
                     super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                   );
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,local_34.impl_.data_.v4.sin_port << 8 |
                             local_34.impl_.data_.v4.sin_port >> 8);
  std::operator<<(poVar1," closed\n");
  std::__cxx11::string::~string((string *)&local_58);
  std::_Function_base::~_Function_base(&(this->_handle_buffer).super__Function_base);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&(this->_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  boost::asio::detail::
  io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~io_object_impl((io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                     *)this_00);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_enable_shared_from_this<cab_session>)._M_weak_this.
              super___weak_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

cab_session::~cab_session()
{
    if(_cab)
        _application->manager().remove(*_cab);

    std::cout << "Cab connection from " << this->_socket.remote_endpoint().address().to_string()
              << ":" << this->_socket.remote_endpoint().port() << " closed\n";
}